

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

void subQuickSort(char *array,int32_t start,int32_t limit,int32_t itemSize,UComparator *cmp,
                 void *context,void *px,void *pw)

{
  int32_t iVar1;
  int local_38;
  int local_34;
  int32_t right;
  int32_t left;
  void *context_local;
  UComparator *cmp_local;
  int local_18;
  int32_t itemSize_local;
  int32_t limit_local;
  int32_t start_local;
  char *array_local;
  
  local_18 = limit;
  itemSize_local = start;
  do {
    if (local_18 <= itemSize_local + 9) {
      doInsertionSort(array + itemSize_local * itemSize,local_18 - itemSize_local,itemSize,cmp,
                      context,px);
      return;
    }
    local_34 = itemSize_local;
    local_38 = local_18;
    memcpy(px,array + (long)((itemSize_local + local_18) / 2) * (long)itemSize,(long)itemSize);
    do {
      while (iVar1 = (*cmp)(context,array + local_34 * itemSize,px), iVar1 < 0) {
        local_34 = local_34 + 1;
      }
      while (iVar1 = (*cmp)(context,px,array + (local_38 + -1) * itemSize), iVar1 < 0) {
        local_38 = local_38 + -1;
      }
      if (local_34 < local_38) {
        local_38 = local_38 + -1;
        if (local_34 < local_38) {
          memcpy(pw,array + (long)local_34 * (long)itemSize,(long)itemSize);
          memcpy(array + (long)local_34 * (long)itemSize,array + (long)local_38 * (long)itemSize,
                 (long)itemSize);
          memcpy(array + (long)local_38 * (long)itemSize,pw,(long)itemSize);
        }
        local_34 = local_34 + 1;
      }
    } while (local_34 < local_38);
    if (local_38 - itemSize_local < local_18 - local_34) {
      if (itemSize_local < local_38 + -1) {
        subQuickSort(array,itemSize_local,local_38,itemSize,cmp,context,px,pw);
      }
      itemSize_local = local_34;
    }
    else {
      if (local_34 < local_18 + -1) {
        subQuickSort(array,local_34,local_18,itemSize,cmp,context,px,pw);
      }
      local_18 = local_38;
    }
  } while (itemSize_local < local_18 + -1);
  return;
}

Assistant:

static void
subQuickSort(char *array, int32_t start, int32_t limit, int32_t itemSize,
             UComparator *cmp, const void *context,
             void *px, void *pw) {
    int32_t left, right;

    /* start and left are inclusive, limit and right are exclusive */
    do {
        if((start+MIN_QSORT)>=limit) {
            doInsertionSort(array+start*itemSize, limit-start, itemSize, cmp, context, px);
            break;
        }

        left=start;
        right=limit;

        /* x=array[middle] */
        uprv_memcpy(px, array+(size_t)((start+limit)/2)*itemSize, itemSize);

        do {
            while(/* array[left]<x */
                  cmp(context, array+left*itemSize, px)<0
            ) {
                ++left;
            }
            while(/* x<array[right-1] */
                  cmp(context, px, array+(right-1)*itemSize)<0
            ) {
                --right;
            }

            /* swap array[left] and array[right-1] via w; ++left; --right */
            if(left<right) {
                --right;

                if(left<right) {
                    uprv_memcpy(pw, array+(size_t)left*itemSize, itemSize);
                    uprv_memcpy(array+(size_t)left*itemSize, array+(size_t)right*itemSize, itemSize);
                    uprv_memcpy(array+(size_t)right*itemSize, pw, itemSize);
                }

                ++left;
            }
        } while(left<right);

        /* sort sub-arrays */
        if((right-start)<(limit-left)) {
            /* sort [start..right[ */
            if(start<(right-1)) {
                subQuickSort(array, start, right, itemSize, cmp, context, px, pw);
            }

            /* sort [left..limit[ */
            start=left;
        } else {
            /* sort [left..limit[ */
            if(left<(limit-1)) {
                subQuickSort(array, left, limit, itemSize, cmp, context, px, pw);
            }

            /* sort [start..right[ */
            limit=right;
        }
    } while(start<(limit-1));
}